

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflection_SwapImplicitPresenceShouldWork_Test::
TestBody(GeneratedMessageReflection_SwapImplicitPresenceShouldWork_Test *this)

{
  byte *pbVar1;
  pointer *__ptr;
  char *message;
  Metadata MVar2;
  AssertionResult gtest_ar;
  TestHasbits rhs;
  TestHasbits lhs;
  Message local_108;
  AssertHelper local_100;
  internal local_f8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  TestHasbits local_e8;
  TestHasbits local_78;
  
  proto3_unittest::TestHasbits::TestHasbits(&local_78,(Arena *)0x0);
  proto3_unittest::TestHasbits::TestHasbits(&local_e8,(Arena *)0x0);
  local_e8.field_0._impl_._has_bits_.has_bits_[0]._3_1_ =
       local_e8.field_0._impl_._has_bits_.has_bits_[0]._3_1_ | 0x80;
  if (local_e8.field_0._impl_.child_ == (TestAllTypes *)0x0) {
    if ((local_e8.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      local_e8.super_Message.super_MessageLite._internal_metadata_.ptr_ =
           *(undefined8 *)
            (local_e8.super_Message.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffe)
      ;
    }
    local_e8.field_0._impl_.child_ =
         (TestAllTypes *)
         Arena::DefaultConstruct<proto3_unittest::TestAllTypes>
                   ((Arena *)local_e8.super_Message.super_MessageLite._internal_metadata_.ptr_);
  }
  ((local_e8.field_0._impl_.child_)->field_0)._impl_.optional_int32_ = -1;
  pbVar1 = (byte *)((long)&(local_e8.field_0._impl_.child_)->field_0 + 1);
  *pbVar1 = *pbVar1 | 0x10;
  MVar2 = proto3_unittest::TestHasbits::GetMetadata
                    ((TestHasbits *)proto3_unittest::_TestHasbits_default_instance_);
  Reflection::Swap(MVar2.reflection,&local_78.super_Message,&local_e8.super_Message);
  if (local_78.field_0._impl_.child_ == (TestAllTypes *)0x0) {
    local_78.field_0._impl_.child_ =
         (TestAllTypes *)proto3_unittest::_TestAllTypes_default_instance_;
  }
  local_108.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = ((local_78.field_0._impl_.child_)->field_0)._impl_.optional_int32_;
  local_100.data_._0_4_ = 0xffffffff;
  testing::internal::CmpHelperEQ<int,int>
            (local_f8,"lhs.child().optional_int32()","-1",(int *)&local_108,(int *)&local_100);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message(&local_108);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_a12c75 + 5;
    }
    else {
      message = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x711,message);
    testing::internal::AssertHelper::operator=(&local_100,&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    if ((long *)CONCAT44(local_108.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         (int32_t)local_108.ss_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_108.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (int32_t)local_108.ss_._M_t.
                                              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              ._M_head_impl) + 8))();
    }
  }
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  proto3_unittest::TestHasbits::~TestHasbits(&local_e8);
  proto3_unittest::TestHasbits::~TestHasbits(&local_78);
  return;
}

Assistant:

TEST(GeneratedMessageReflection, SwapImplicitPresenceShouldWork) {
  proto3_unittest::TestHasbits lhs, rhs;
  rhs.mutable_child()->set_optional_int32(-1);
  lhs.GetReflection()->Swap(&lhs, &rhs);
  EXPECT_EQ(lhs.child().optional_int32(), -1);
}